

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O1

void qpCrashHandler_writeCrashInfo
               (qpCrashHandler *crashHandler,qpWriteCrashInfoFunc writeInfo,void *userPtr)

{
  qpCrashType qVar1;
  int __fd;
  uint uVar2;
  __off_t _Var3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  char *format;
  ulong uVar7;
  ulong uVar8;
  char c;
  char tmpFileName [17];
  char nameBuffer [256];
  void *symbols [32];
  char local_261;
  ulong local_260;
  char local_258 [32];
  char local_238 [255];
  undefined1 local_139;
  undefined8 local_138 [33];
  
  qVar1 = (crashHandler->crashInfo).type;
  pcVar6 = (crashHandler->crashInfo).message;
  if (qVar1 == QP_CRASHTYPE_UNHANDLED_EXCEPTION) {
    format = "Unhandled exception: \'%s\'\n";
  }
  else {
    if (qVar1 == QP_CRASHTYPE_ASSERT) {
      writeInfoFormat(writeInfo,userPtr,"Assertion \'%s\' failed at %s:%d\n",pcVar6,
                      (crashHandler->crashInfo).file,(ulong)(uint)(crashHandler->crashInfo).line);
      goto LAB_01a289cc;
    }
    if (qVar1 == QP_CRASHTYPE_SEGMENTATION_FAULT) {
      format = "Segmentation fault: \'%s\'\n";
    }
    else {
      format = "Crash: \'%s\'\n";
    }
  }
  writeInfoFormat(writeInfo,userPtr,format,pcVar6);
LAB_01a289cc:
  builtin_strncpy(local_258,"backtrace-XXXXXX",0x11);
  __fd = mkstemp(local_258);
  if (__fd == -1) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    writeInfoFormat(writeInfo,userPtr,"Failed to create tmpfile \'%s\' for the backtrace %s.",
                    local_258,pcVar6);
  }
  else {
    remove(local_258);
    uVar2 = backtrace(local_138,0x20);
    backtrace_symbols_fd(local_138,uVar2,__fd);
    _Var3 = lseek(__fd,0,0);
    if (_Var3 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      writeInfoFormat(writeInfo,userPtr,"Failed to seek to the beginning of the trace file %s.",
                      pcVar6);
    }
    else {
      if (0 < (int)uVar2) {
        uVar8 = 0;
        local_260 = (ulong)uVar2;
        do {
          uVar2 = snprintf(local_238,0x100,"0x%016lX : ",local_138[uVar8]);
          if ((int)uVar2 < 0) {
            writeInfoFormat(writeInfo,userPtr,"Failed to print symbol pointer.");
            uVar7 = 0;
          }
          else if ((int)uVar2 < 0x100) {
            uVar7 = (ulong)uVar2;
          }
          else {
            local_139 = 0;
            uVar7 = 0xff;
          }
          while (sVar4 = read(__fd,&local_261,1), sVar4 == 1) {
            if (local_261 == '\n') {
              local_238[uVar7] = '\0';
              (*writeInfo)(userPtr,local_238);
              goto LAB_01a28b23;
            }
            if (uVar7 < 0xff) {
              local_238[uVar7] = local_261;
              uVar7 = uVar7 + 1;
            }
          }
          local_238[uVar7] = '\0';
          (*writeInfo)(userPtr,local_238);
          writeInfoFormat(writeInfo,userPtr,"Unexpected EOF reading backtrace file \'%s\'",local_258
                         );
          close(__fd);
          __fd = -1;
LAB_01a28b23:
        } while ((__fd != -1) && (uVar8 = uVar8 + 1, uVar8 != local_260));
      }
      if (__fd == -1) {
        return;
      }
    }
    close(__fd);
  }
  return;
}

Assistant:

void qpCrashHandler_writeCrashInfo (qpCrashHandler* crashHandler, qpWriteCrashInfoFunc writeInfo, void* userPtr)
{
	qpCrashInfo_write(&crashHandler->crashInfo, writeInfo, userPtr);

#if (DE_OS == DE_OS_UNIX)
	{
		char	tmpFileName[]	= "backtrace-XXXXXX";
		int		tmpFile			= mkstemp(tmpFileName);

		if (tmpFile == -1)
		{
			writeInfoFormat(writeInfo, userPtr, "Failed to create tmpfile '%s' for the backtrace %s.", tmpFileName, strerror(errno));
			return;
		}
		else
		{
			void*	symbols[32];
			int		symbolCount;
			int		symbolNdx;

			/* Remove file from filesystem. */
			remove(tmpFileName);

			symbolCount = backtrace(symbols, DE_LENGTH_OF_ARRAY(symbols));
			backtrace_symbols_fd(symbols, symbolCount, tmpFile);

			if (lseek(tmpFile, 0, SEEK_SET) < 0)
			{
				writeInfoFormat(writeInfo, userPtr, "Failed to seek to the beginning of the trace file %s.", strerror(errno));
				close(tmpFile);
				return;
			}

			for (symbolNdx = 0; symbolNdx < symbolCount; symbolNdx++)
			{
				char	nameBuffer[256];
				size_t	symbolNameLength = 0;
				char	c;

				{
					const int ret = snprintf(nameBuffer, DE_LENGTH_OF_ARRAY(nameBuffer), PTR_FMT  PRIXPTR " : ", (uintptr_t)symbols[symbolNdx]);

					if (ret < 0)
					{
						writeInfoFormat(writeInfo, userPtr, "Failed to print symbol pointer.");
						symbolNameLength = 0;
					}
					else if (ret >= DE_LENGTH_OF_ARRAY(nameBuffer))
					{
						symbolNameLength = DE_LENGTH_OF_ARRAY(nameBuffer) - 1;
						nameBuffer[DE_LENGTH_OF_ARRAY(nameBuffer) - 1] = '\0';
					}
					else
						symbolNameLength = ret;
				}

				for (;;)
				{
					if (read(tmpFile, &c, 1) == 1)
					{
						if (c == '\n')
						{
							/* Flush nameBuffer and move to next symbol. */
							nameBuffer[symbolNameLength] = '\0';
							writeInfo(userPtr, nameBuffer);
							break;
						}
						else
						{
							/* Add character to buffer if there is still space left. */
							if (symbolNameLength+1 < DE_LENGTH_OF_ARRAY(nameBuffer))
							{
								nameBuffer[symbolNameLength] = c;
								symbolNameLength++;
							}
						}
					}
					else
					{
						/* Flush nameBuffer. */
						nameBuffer[symbolNameLength] = '\0';
						writeInfo(userPtr, nameBuffer);

						/* Temp file ended unexpectedly? */
						writeInfoFormat(writeInfo, userPtr, "Unexpected EOF reading backtrace file '%s'", tmpFileName);
						close(tmpFile);
						tmpFile = -1;

						break;
					}
				}

				if (tmpFile == -1)
					break;
			}

			if (tmpFile != -1)
				close(tmpFile);
		}
	}
#endif
}